

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

FFSEncodeVector fixup_output_vector(FFSBuffer b,estate s)

{
  ssize_t sVar1;
  FFSBuffer in_RSI;
  long *in_RDI;
  int i;
  FFSEncodeVector ret;
  ssize_t tmp_vec_offset;
  int size;
  int local_34;
  undefined4 in_stack_ffffffffffffffe0;
  FFSEncodeVector local_8;
  
  sVar1 = add_to_tmp_buffer(in_RSI,CONCAT44((*(int *)((long)&in_RSI->tmp_buffer_in_use_size + 4) + 5
                                            ) * 0x10,in_stack_ffffffffffffffe0));
  if (sVar1 == -1) {
    local_8 = (FFSEncodeVector)0x0;
  }
  else {
    local_8 = (FFSEncodeVector)(*in_RDI + ((sVar1 + 0xfU) - (sVar1 + 0xfU & 0xf)) + 0x30);
    for (local_34 = 0; local_34 < *(int *)((long)&in_RSI->tmp_buffer_in_use_size + 4);
        local_34 = local_34 + 1) {
      local_8[local_34].iov_len =
           *(size_t *)((long)in_RSI[1].tmp_buffer + (long)local_34 * 0x18 + 0x10);
      if (*(long *)((long)in_RSI[1].tmp_buffer + (long)local_34 * 0x18) == 0) {
        local_8[local_34].iov_base =
             (void *)(*in_RDI + *(long *)((long)in_RSI[1].tmp_buffer + (long)local_34 * 0x18 + 8));
      }
      else {
        local_8[local_34].iov_base = *(void **)((long)in_RSI[1].tmp_buffer + (long)local_34 * 0x18);
      }
    }
    local_8[*(int *)((long)&in_RSI->tmp_buffer_in_use_size + 4)].iov_base = (void *)0x0;
    local_8[*(int *)((long)&in_RSI->tmp_buffer_in_use_size + 4)].iov_len = 0;
    if ((int)in_RSI->tmp_buffer_in_use_size == 0) {
      free(in_RSI[1].tmp_buffer);
      in_RSI[1].tmp_buffer = (void *)0x0;
    }
    if (((int)in_RSI[1].tmp_buffer_in_use_size == 0) && (in_RSI[2].tmp_buffer != (void *)0x0)) {
      free(in_RSI[2].tmp_buffer);
      in_RSI[2].tmp_buffer = (void *)0x0;
    }
  }
  return local_8;
}

Assistant:

static FFSEncodeVector
fixup_output_vector(FFSBuffer b, estate s)
{
    int size = (s->iovcnt + 5) * sizeof(struct FFSEncodeVec);
    ssize_t tmp_vec_offset = add_to_tmp_buffer(b, size);
    FFSEncodeVector ret;
    /* buffer will not be realloc'd after this */
    int i;

    if (tmp_vec_offset == -1) return NULL;

    tmp_vec_offset += sizeof(ret[0]) - 1;
    tmp_vec_offset -= tmp_vec_offset % sizeof(ret[0]);
    ret = (FFSEncodeVector)(((char*)b->tmp_buffer) + tmp_vec_offset);
    /* leave two blanks, see notes in ffs_file.c */
    /* the upshot is that we use these if we need to add headers */
    ret += 3;
    for (i=0; i < s->iovcnt; i++) {
	ret[i].iov_len = s->iovec[i].iov_len;
	if (s->iovec[i].iov_base != NULL) {
	    ret[i].iov_base = s->iovec[i].iov_base;
	} else {
	    ret[i].iov_base = ((char*)b->tmp_buffer) + s->iovec[i].iov_offset;
	}
    }
    ret[s->iovcnt].iov_base = NULL;
    ret[s->iovcnt].iov_len = 0;
    if (!s->iovec_is_stack) {
	free(s->iovec);
	s->iovec = NULL;
    }
    if (!s->addr_list_is_stack && (s->addr_list != NULL)) {
	free(s->addr_list);
	s->addr_list = NULL;
    }
    return ret;
}